

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O3

int checkscript(void)

{
  int iVar1;
  __pid_t pid;
  int *piVar2;
  char *pcVar3;
  char *prog [2];
  stat s;
  char *local_c8;
  undefined8 local_c0;
  stat local_b0;
  
  iVar1 = stat("check",&local_b0);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == error_noent) {
      return 1;
    }
    buffer_puts(buffer_2,"warning: ");
    pcVar3 = "unable to stat ";
  }
  else {
    pid = fork();
    if (pid == -1) {
      buffer_puts(buffer_2,"warning: ");
      buffer_puts(buffer_2,"unable to fork for ");
      buffer_puts(buffer_2,*service);
      buffer_puts(buffer_2,"/check: ");
      piVar2 = __errno_location();
      pcVar3 = error_str(*piVar2);
      buffer_puts(buffer_2,pcVar3);
      buffer_puts(buffer_2,"\n");
      goto LAB_00102b33;
    }
    if (pid == 0) {
      local_c8 = "./check";
      local_c0 = 0;
      close(1);
      execve("check",&local_c8,_environ);
      outs2("warning: ");
      outs2("unable to run ");
      outs2(*service);
      outs2("/check: ");
      piVar2 = __errno_location();
      pcVar3 = error_str(*piVar2);
      outs2(pcVar3);
      flush2("\n");
      _exit(0);
    }
    do {
      iVar1 = wait_pid((int *)&local_c8,pid);
      if (iVar1 != -1) {
        return (uint)((uint)local_c8 < 0x100);
      }
      piVar2 = __errno_location();
    } while (*piVar2 == error_intr);
    buffer_puts(buffer_2,"warning: ");
    pcVar3 = "unable to wait for child ";
  }
  buffer_puts(buffer_2,pcVar3);
  buffer_puts(buffer_2,*service);
  buffer_puts(buffer_2,"/check: ");
  pcVar3 = error_str(*piVar2);
  buffer_puts(buffer_2,pcVar3);
  buffer_puts(buffer_2,"\n");
LAB_00102b33:
  buffer_flush(buffer_2);
  return 0;
}

Assistant:

int checkscript() {
  char *prog[2];
  struct stat s;
  int pid, w;

  if (stat("check", &s) == -1) {
    if (errno == error_noent) return(1);
    outs2(WARN); outs2("unable to stat "); outs2(*service); outs2("/check: ");
    outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  /* if (!(s.st_mode & S_IXUSR)) return(1); */
  if ((pid =fork()) == -1) {
    outs2(WARN); outs2("unable to fork for "); outs2(*service);
    outs2("/check: "); outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  if (!pid) {
    prog[0] ="./check";
    prog[1] =0;
    close(1);
    execve("check", prog, environ);
    outs2(WARN); outs2("unable to run "); outs2(*service); outs2("/check: ");
    outs2(error_str(errno)); flush2("\n");
    _exit(0);
  }
  while (wait_pid(&w, pid) == -1) {
    if (errno == error_intr) continue;
    outs2(WARN); outs2("unable to wait for child "); outs2(*service);
    outs2("/check: "); outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  return(!wait_exitcode(w));
}